

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenio::save_edges(tetgenio *this,char *filebasename)

{
  FILE *__stream;
  int local_42c;
  char local_428 [4];
  int i;
  char outedgefilename [1024];
  FILE *fout;
  char *filebasename_local;
  tetgenio *this_local;
  
  sprintf(local_428,"%s.edge",filebasename);
  printf("Saving edges to %s\n",local_428);
  __stream = fopen(local_428,"w");
  fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberofedges,
          (ulong)(this->edgemarkerlist != (int *)0x0));
  for (local_42c = 0; local_42c < this->numberofedges; local_42c = local_42c + 1) {
    fprintf(__stream,"%d  %4d  %4d",(ulong)(uint)(local_42c + this->firstnumber),
            (ulong)(uint)this->edgelist[local_42c << 1],
            (ulong)(uint)this->edgelist[local_42c * 2 + 1]);
    if (this->edgemarkerlist != (int *)0x0) {
      fprintf(__stream,"  %d",(ulong)(uint)this->edgemarkerlist[local_42c]);
    }
    fprintf(__stream,"\n");
  }
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_edges(char* filebasename)
{
  FILE *fout;
  char outedgefilename[FILENAMESIZE];
  int i;

  sprintf(outedgefilename, "%s.edge", filebasename);
  printf("Saving edges to %s\n", outedgefilename);
  fout = fopen(outedgefilename, "w");
  fprintf(fout, "%d  %d\n", numberofedges, edgemarkerlist != NULL ? 1 : 0);
  for (i = 0; i < numberofedges; i++) {
    fprintf(fout, "%d  %4d  %4d", i + firstnumber, edgelist[i * 2],
            edgelist[i * 2 + 1]);
    if (edgemarkerlist != NULL) {
      fprintf(fout, "  %d", edgemarkerlist[i]);
    }
    fprintf(fout, "\n");
  }

  fclose(fout);
}